

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_gzip.c
# Opt level: O2

void test_write_filter_gzip(void)

{
  int iVar1;
  wchar_t wVar2;
  byte *pbVar3;
  byte *pbVar4;
  archive *paVar5;
  char *pcVar6;
  archive_entry *entry;
  la_ssize_t lVar7;
  la_int64_t lVar8;
  uint uVar9;
  longlong v1;
  archive_entry *ae;
  byte *local_70;
  size_t used2;
  byte *local_60;
  int local_54;
  size_t used1;
  char path [16];
  
  pbVar3 = (byte *)malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                   ,L'/',(uint)(pbVar3 != (byte *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  if (pbVar3 == (byte *)0x0) {
    return;
  }
  pbVar4 = (byte *)calloc(1,10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                   ,L'4',(uint)(pbVar4 != (byte *)0x0),"NULL != (data = malloc(datasize))",
                   (void *)0x0);
  local_60 = pbVar4;
  if (pbVar4 != (byte *)0x0) {
    paVar5 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'?',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar5)
    ;
    local_54 = archive_write_add_filter_gzip(paVar5);
    if ((local_54 == 0) || (wVar2 = canGzip(), local_54 == -0x14 && wVar2 != L'\0')) {
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'N',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'O',1,"ARCHIVE_FILTER_GZIP",(long)iVar1,"archive_filter_code(a, 0)",
                          (void *)0x0);
      pcVar6 = archive_filter_name(paVar5,0);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                 ,L'P',"gzip","\"gzip\"",pcVar6,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
      local_70 = pbVar3;
      iVar1 = archive_write_open_memory(paVar5,pbVar3,2000000,&used1);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'R',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used1)",paVar5);
      entry = archive_entry_new();
      ae = entry;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'S',(uint)(entry != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,10000);
      for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
        snprintf(path,0x10,"file%03d",(ulong)uVar9);
        archive_entry_copy_pathname(entry,path);
        iVar1 = archive_write_header(paVar5,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
        lVar7 = archive_write_data(paVar5,local_60,10000);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'[',(uint)(lVar7 == 10000),
                         "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
      }
      archive_entry_free(entry);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      pbVar3 = local_70;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'c',(ulong)*local_70,"rbuff[0]",0x1f,"0x1f",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'd',(ulong)pbVar3[1],"rbuff[1]",0x8b,"0x8b",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'e',(ulong)pbVar3[2],"rbuff[2]",8,"0x08",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'f',(ulong)pbVar3[3],"rbuff[3]",0,"0x00",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'g',(ulong)pbVar3[8],"rbuff[8]",0,"0",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'i',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'j',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if (iVar1 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'm');
        test_skipping(
                     "Can\'t verify gzip writing by reading back; gzip reading not fully supported on this platform"
                     );
      }
      else {
        iVar1 = archive_read_open_memory(paVar5,pbVar3,CONCAT44(used1._4_4_,(uint)used1));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'q',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used1)",paVar5);
        for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
          snprintf(path,0x10,"file%03d",(ulong)uVar9);
          iVar1 = archive_read_next_header(paVar5,&ae);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'u',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(ae);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'w',path,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          lVar8 = archive_entry_size(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'x',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",(void *)0x0
                             );
        }
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      }
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'\x82',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                       ,(void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      v1 = -0x14;
      if (local_54 == 0) {
        v1 = 0;
      }
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x87',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:nonexistent-option=0");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x89',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:nonexistent-option=0\")",paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:compression-level=1");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x8b',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:compression-level=1\")",paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","9");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")",
                          paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","abc");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x8f',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                          ,paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","99");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x91',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                          paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:compression-level=9");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:compression-level=9\")",paVar5);
      iVar1 = archive_write_open_memory(paVar5,local_70,2000000,&used2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
        snprintf(path,0x10,"file%03d",(ulong)uVar9);
        ae = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'\x97',(uint)(ae != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_copy_pathname(ae,path);
        archive_entry_set_size(ae,10000);
        archive_entry_set_filetype(ae,0x8000);
        iVar1 = archive_write_header(paVar5,ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5
                           );
        lVar7 = archive_write_data(paVar5,local_60,10000);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'\x9c',(uint)(lVar7 == 10000),
                         "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
        archive_entry_free(ae);
      }
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x9f',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      pbVar3 = local_70;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¤',(ulong)*local_70,"rbuff[0]",0x1f,"0x1f",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¥',(ulong)pbVar3[1],"rbuff[1]",0x8b,"0x8b",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¦',(ulong)pbVar3[2],"rbuff[2]",8,"0x08",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'§',(ulong)pbVar3[3],"rbuff[3]",0,"0x00",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¨',(ulong)pbVar3[8],"rbuff[8]",2,"2",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'²',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if ((local_54 == 0) && (iVar1 != 0)) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'¶');
        test_skipping("gzip reading not fully supported on this platform");
      }
      else {
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'¹',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar1 = archive_read_open_memory(paVar5,pbVar3,CONCAT44(used2._4_4_,(uint)used2));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'»',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
          snprintf(path,0x10,"file%03d",(ulong)uVar9);
          iVar1 = archive_read_next_header(paVar5,&ae);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'¿',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(ae);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'Á',path,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          lVar8 = archive_entry_size(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'Â',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",
                              (void *)0x0);
        }
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
        pbVar3 = local_70;
      }
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Æ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ë',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ì',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Î',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ð',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","1");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ò',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")",
                          paVar5);
      iVar1 = archive_write_open_memory(paVar5,pbVar3,2000000,&used2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ô',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
        snprintf(path,0x10,"file%03d",(ulong)uVar9);
        ae = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'×',(uint)(ae != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_copy_pathname(ae,path);
        archive_entry_set_size(ae,10000);
        archive_entry_set_filetype(ae,0x8000);
        iVar1 = archive_write_header(paVar5,ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Û',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
        failure("Writing file %s",path);
        lVar7 = archive_write_data(paVar5,local_60,10000);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Þ',10000,"datasize",lVar7,
                            "(size_t)archive_write_data(a, data, datasize)",paVar5);
        archive_entry_free(ae);
      }
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'á',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'â',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",(ulong)(uint)used2,
              (ulong)(uint)used1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ç',(uint)(CONCAT44(used1._4_4_,(uint)used1) <
                                    CONCAT44(used2._4_4_,(uint)used2)),"used2 > used1",(void *)0x0);
      pbVar3 = local_70;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ë',(ulong)*local_70,"rbuff[0]",0x1f,"0x1f",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ì',(ulong)pbVar3[1],"rbuff[1]",0x8b,"0x8b",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'í',(ulong)pbVar3[2],"rbuff[2]",8,"0x08",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'î',(ulong)pbVar3[3],"rbuff[3]",0,"0x00",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ï',(ulong)pbVar3[8],"rbuff[8]",4,"4",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ñ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ò',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if (iVar1 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ö');
        test_skipping("gzip reading not fully supported on this platform");
      }
      else {
        iVar1 = archive_read_open_memory(paVar5,pbVar3,CONCAT44(used2._4_4_,(uint)used2));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'ù',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
          snprintf(path,0x10,"file%03d",(ulong)uVar9);
          iVar1 = archive_read_next_header(paVar5,&ae);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'ý',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(ae);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'ÿ',path,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          lVar8 = archive_entry_size(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'Ā',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",
                              (void *)0x0);
        }
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      }
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ą',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ċ',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Č',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'č',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ď',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'đ',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ē',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ē',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ĕ',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ė',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ę',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ę',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ě',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ĝ',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ĝ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ğ',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                          "archive_write_add_filter_gzip(a)",paVar5);
      pbVar3 = local_70;
      iVar1 = archive_write_open_memory(paVar5,local_70,2000000,&used2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ġ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ġ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ģ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(local_60);
      free(pbVar3);
      return;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                   ,L'F');
    test_skipping("gzip writing not supported on this platform");
    iVar1 = archive_write_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                        ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(pbVar3);
    pbVar3 = local_60;
  }
  free(pbVar3);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_gzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	unsigned char *rbuff;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 * Use default compression level (6).
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_gzip(a);
	if (r != ARCHIVE_OK) {
		if (canGzip() && r == ARCHIVE_WARN)
			use_prog = 1;
		else {
			skipping("gzip writing not supported on this platform");
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			free(data);
			return;
		}
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_GZIP, archive_filter_code(a, 0));
	assertEqualString("gzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Basic gzip header tests */
	rbuff = (unsigned char *)buff;
	assertEqualInt(rbuff[0], 0x1f);
	assertEqualInt(rbuff[1], 0x8b);
	assertEqualInt(rbuff[2], 0x08);
	assertEqualInt(rbuff[3], 0x00);
	assertEqualInt(rbuff[8], 0); /* RFC 1952 flag for compression level 6 */

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify gzip writing by reading back;"
		    " gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options. Compression level is 9.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "gzip:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Basic gzip header tests */
	rbuff = (unsigned char *)buff;
	assertEqualInt(rbuff[0], 0x1f);
	assertEqualInt(rbuff[1], 0x8b);
	assertEqualInt(rbuff[2], 0x08);
	assertEqualInt(rbuff[3], 0x00);
	assertEqualInt(rbuff[8], 2); /* RFC 1952 flag for compression level 9 */

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with compression level 1
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Level 1 really does result in larger data. */
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);

	/* Basic gzip header tests */
	rbuff = (unsigned char *)buff;
	assertEqualInt(rbuff[0], 0x1f);
	assertEqualInt(rbuff[1], 0x8b);
	assertEqualInt(rbuff[2], 0x08);
	assertEqualInt(rbuff[3], 0x00);
	assertEqualInt(rbuff[8], 4); /* RFC 1952 flag for compression level 1 */

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}